

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrib.c
# Opt level: O2

boolean adjattrib(int ndx,int incr,boolean force,int msgflg)

{
  schar sVar1;
  char cVar2;
  int iVar3;
  char cVar4;
  char **ppcVar5;
  char *pcVar6;
  boolean bVar7;
  
  if (incr == 0) {
    return '\0';
  }
  if (force == '\0' && u.uprops[0x3b].extrinsic != 0) {
    return '\0';
  }
  if ((uarmh == (obj *)0x0 || (ndx - 3U < 0xfffffffe || force != '\0')) || (uarmh->otyp != 0x4d)) {
    if (incr < 1) {
      cVar4 = u.acurr.a[ndx];
      cVar2 = urace.attrmin[ndx];
      if (cVar4 <= cVar2) {
        if ((msgflg == 0) && (flags.verbose != '\0')) {
          pline("You\'re already as %s as you can get.",minusattr[ndx]);
          cVar2 = urace.attrmin[ndx];
        }
        goto LAB_0014e490;
      }
      cVar4 = cVar4 + (char)incr;
      u.acurr.a[ndx] = cVar4;
      if (cVar4 < cVar2) {
        incr = (int)cVar4 - (int)cVar2;
        u.acurr.a[ndx] = cVar2;
        cVar4 = u.amax.a[ndx] + (char)incr;
        if (cVar2 < cVar4) {
          cVar2 = cVar4;
        }
        u.amax.a[ndx] = cVar2;
      }
    }
    else {
      cVar4 = u.amax.a[ndx];
      if (((ndx == 0) && (u.umonnum != u.umonster)) && (((youmonst.data)->mflags2 & 0x4000000) != 0)
         ) {
        iVar3 = 0x76;
      }
      else {
        iVar3 = (int)urace.attrmax[ndx];
      }
      if ((iVar3 <= cVar4) && (sVar1 = acurr(ndx), cVar4 <= sVar1)) {
        if ((msgflg == 0) && (flags.verbose != '\0')) {
          pline("You\'re already as %s as you can get.",plusattr[ndx]);
        }
        if (((ndx != 0) || (u.umonnum == u.umonster)) ||
           (cVar2 = 'v', ((youmonst.data)->mflags2 & 0x4000000) == 0)) {
          cVar2 = urace.attrmax[ndx];
        }
        u.amax.a[ndx] = cVar2;
LAB_0014e490:
        u.acurr.a[ndx] = cVar2;
        goto LAB_0014e498;
      }
      sVar1 = u.acurr.a[ndx] + (char)incr;
      u.acurr.a[ndx] = sVar1;
      if (sVar1 <= cVar4) goto LAB_0014e378;
      iVar3 = (int)sVar1;
      u.amax.a[ndx] = sVar1;
      if ((ndx == 0) && (u.umonnum != u.umonster)) {
        if (((youmonst.data)->mflags2 & 0x4000000) == 0) {
          if (urace.attrmax[ndx] < sVar1) {
LAB_0014e4e2:
            sVar1 = 'v';
            if (((youmonst.data)->mflags2 & 0x4000000) == 0) goto LAB_0014e2fc;
            goto LAB_0014e308;
          }
        }
        else if ('v' < sVar1) goto LAB_0014e4e2;
      }
      else {
        if (sVar1 <= urace.attrmax[ndx]) goto LAB_0014e310;
LAB_0014e2fc:
        sVar1 = urace.attrmax[ndx];
LAB_0014e308:
        u.amax.a[ndx] = sVar1;
      }
LAB_0014e310:
      incr = iVar3 - cVar4;
      u.acurr.a[ndx] = sVar1;
    }
LAB_0014e378:
    if (msgflg < 1) {
      pcVar6 = "";
      if (incr - 2U < 0xfffffffd) {
        pcVar6 = "very ";
      }
      ppcVar5 = minusattr;
      if (0 < incr) {
        ppcVar5 = plusattr;
      }
      pline("You feel %s%s!",pcVar6,ppcVar5[ndx]);
    }
    iflags.botl = '\x01';
    bVar7 = '\x01';
    if (((ndx & 0xfffffffbU) == 0) && (1 < moves)) {
      encumber_msg();
    }
  }
  else {
    if (msgflg == 0) {
      pline("Your cap constricts briefly, then relaxes again.");
      return '\0';
    }
LAB_0014e498:
    bVar7 = '\0';
  }
  return bVar7;
}

Assistant:

boolean adjattrib(
	int ndx,
	int incr,
	boolean force,
	int msgflg	    /* positive => no message, zero => message, and */
	                    /* negative => conditional (msg if change made) */
	)
{			    
	if ((Fixed_abil && !force) || !incr) return FALSE;

	if ((ndx == A_INT || ndx == A_WIS) &&
	    !force && uarmh && uarmh->otyp == DUNCE_CAP) {
		if (msgflg == 0)
		    pline("Your cap constricts briefly, then relaxes again.");
		return FALSE;
	}

	if (incr > 0) {
	    if ((AMAX(ndx) >= ATTRMAX(ndx)) && (ACURR(ndx) >= AMAX(ndx))) {
		if (msgflg == 0 && flags.verbose)
		    pline("You're already as %s as you can get.",
			  plusattr[ndx]);
		ABASE(ndx) = AMAX(ndx) = ATTRMAX(ndx); /* just in case */
		return FALSE;
	    }

	    ABASE(ndx) += incr;
	    if (ABASE(ndx) > AMAX(ndx)) {
		incr = ABASE(ndx) - AMAX(ndx);
		AMAX(ndx) += incr;
		if (AMAX(ndx) > ATTRMAX(ndx))
		    AMAX(ndx) = ATTRMAX(ndx);
		ABASE(ndx) = AMAX(ndx);
	    }
	} else {
	    if (ABASE(ndx) <= ATTRMIN(ndx)) {
		if (msgflg == 0 && flags.verbose)
		    pline("You're already as %s as you can get.",
			  minusattr[ndx]);
		ABASE(ndx) = ATTRMIN(ndx); /* just in case */
		return FALSE;
	    }

	    ABASE(ndx) += incr;
	    if (ABASE(ndx) < ATTRMIN(ndx)) {
		incr = ABASE(ndx) - ATTRMIN(ndx);
		ABASE(ndx) = ATTRMIN(ndx);
		AMAX(ndx) += incr;
		if (AMAX(ndx) < ATTRMIN(ndx))
		    AMAX(ndx) = ATTRMIN(ndx);
	    }
	}
	if (msgflg <= 0)
	    pline("You feel %s%s!",
		  (incr > 1 || incr < -1) ? "very ": "",
		  (incr > 0) ? plusattr[ndx] : minusattr[ndx]);
	iflags.botl = 1;
	if (moves > 1 && (ndx == A_STR || ndx == A_CON))
		encumber_msg();
	return TRUE;
}